

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O3

string * __thiscall
pstore::file::system_error::message<std::__cxx11::string>
          (string *__return_storage_ptr__,system_error *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *user_message,
          string *path)

{
  ostream *poVar1;
  ostringstream stream;
  char local_199;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,(user_message->_M_dataplus)._M_p,user_message->_M_string_length);
  if (path->_M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198," \"",2);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,(path->_M_dataplus)._M_p,path->_M_string_length);
    local_199 = '\"';
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_199,1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string system_error::message (MessageStringType const & user_message,
                                           std::string const & path) {
            std::ostringstream stream;
            stream << user_message;
            if (path.length () > 0) {
                stream << " \"" << path << '\"';
            }
            return stream.str ();
        }